

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void loop(void)

{
  bool bVar1;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  int local_14;
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  
  vera::updateGL();
  glClear(0x4100);
  if ((((bTerminate & 1U) != 0) || ((bRunAtFullFps & 1U) != 0)) ||
     (bVar1 = Sandbox::haveChange(&sandbox), bVar1)) {
    Sandbox::renderPrep(&sandbox);
    Sandbox::render(&sandbox);
    Sandbox::renderPost(&sandbox);
    Sandbox::renderUI(&sandbox);
    Sandbox::renderDone(&sandbox);
    if (((bTerminate & 1U) == 0) || (bVar1 = std::operator==(&sandbox.screenshotFile,""), !bVar1)) {
      bVar1 = Tracker::isRunning(&sandbox.uniforms.tracker);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_38,"render:swap",&local_39);
        Tracker::begin(&sandbox.uniforms.tracker,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator((allocator<char> *)&local_39);
      }
    }
    else {
      std::atomic<bool>::store(&bKeepRunnig,false,memory_order_seq_cst);
    }
    vera::renderGL();
    bVar1 = Tracker::isRunning(&sandbox.uniforms.tracker);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_70,"render:swap",&local_71);
      Tracker::end(&sandbox.uniforms.tracker,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
  }
  else {
    local_14 = vera::getRestMs();
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_10,&local_14);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_10);
  }
  return;
}

Assistant:

void loop() {
#endif

    // update time/delta/date and input events
    vera::updateGL();
    glClear( GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT );

    #ifdef __EMSCRIPTEN__
    // Excecute commands in the main loop in WASM/EMSCRIPTEN project because there is no multiple threads
    if (sandbox.isReady() && commandsArgs.size() > 0) {
        for (size_t i = 0; i < commandsArgs.size(); i++)
            commandsRun(commandsArgs[i]);
        commandsArgs.clear();
    }
    #else
    // If nothing in the scene change skip the frame and try to keep it at 60fps
    if (!bTerminate && !bRunAtFullFps && !sandbox.haveChange()) {
        std::this_thread::sleep_for(std::chrono::milliseconds( vera::getRestMs() ));
        return;
    }
    #endif

    // PREP for main render:
    //  - update uniforms
    //  - render buffers, double buffers and pyramid convolutions
    //  - render lighmaps (3D scenes only)
    //  - render normal/possition/extra g buffers (3D scenes only)
    //  - start the recording FBO (when recording)
    sandbox.renderPrep();

    // Render the main 2D Shader on a billboard or 3D Scene when there is geometry models
    // Note: if the render require multiple views of the render (for quilts or VR) it happens here.
    sandbox.render();

    // POST render:
    //  - post-processing render pass
    //  - close recording FBO (when recording)
    sandbox.renderPost();

    // UI render pass:
    //  - draw textures (debug)
    //  - draw render passes/buffers (debug)
    //  - draw plot widget (debug)
    //  - draw cursor
    //  - draw help prompt
    sandbox.renderUI();

    // Finish rendering triggering some events like
    //  - save image/frame if it's needed
    //  - anouncing the first pass have been made
    sandbox.renderDone();

#ifndef __EMSCRIPTEN__
    if ( bTerminate && sandbox.screenshotFile == "" )
        bKeepRunnig.store(false);
    else
#endif
    
    // Swap GL buffer
    TRACK_BEGIN("render:swap")
    vera::renderGL();
    TRACK_END("render:swap")

    #if defined(__EMSCRIPTEN__)
    return (vera::getXR() == vera::NONE_XR_MODE);
    #endif
}